

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vcd_trace.cpp
# Opt level: O0

ssize_t __thiscall
sc_core::vcd_sc_signed_trace::write(vcd_sc_signed_trace *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  int iVar2;
  vector<char,_std::allocator<char>_> *this_00;
  sc_signed *psVar3;
  reference __s;
  undefined4 in_register_00000034;
  int bitindex;
  char *rawdata_ptr;
  size_t sz;
  sc_signed *in_stack_ffffffffffffff40;
  allocator_type *in_stack_ffffffffffffff48;
  sc_signed *in_stack_ffffffffffffff50;
  size_type in_stack_ffffffffffffff58;
  allocator<char> *__n_00;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  allocator<char> *in_stack_ffffffffffffff68;
  vcd_trace *in_stack_ffffffffffffff70;
  int local_7c;
  char *local_78;
  allocator_type local_6a;
  undefined1 local_69;
  allocator<char> local_4a;
  undefined1 local_49;
  sc_signed *local_30;
  allocator<char> local_26;
  undefined1 local_25;
  undefined1 local_12 [18];
  
  local_12._2_8_ = CONCAT44(in_register_00000034,__fd);
  local_12._10_8_ = this;
  if (write(_IO_FILE*)::compdata == '\0') {
    iVar2 = __cxa_guard_acquire(&write(_IO_FILE*)::compdata);
    if (iVar2 != 0) {
      local_12[1] = 0;
      in_stack_ffffffffffffff70 = (vcd_trace *)local_12;
      std::allocator<char>::allocator();
      std::vector<char,_std::allocator<char>_>::vector
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                 (value_type_conflict *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      std::allocator<char>::~allocator((allocator<char> *)local_12);
      __cxa_atexit(std::vector<char,_std::allocator<char>_>::~vector,&write::compdata,&__dso_handle)
      ;
      __cxa_guard_release(&write(_IO_FILE*)::compdata);
    }
  }
  if (write(_IO_FILE*)::rawdata == '\0') {
    iVar2 = __cxa_guard_acquire(&write(_IO_FILE*)::rawdata);
    if (iVar2 != 0) {
      local_25 = 0;
      in_stack_ffffffffffffff68 = &local_26;
      std::allocator<char>::allocator();
      std::vector<char,_std::allocator<char>_>::vector
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                 (value_type_conflict *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      std::allocator<char>::~allocator(&local_26);
      __cxa_atexit(std::vector<char,_std::allocator<char>_>::~vector,&write::rawdata,&__dso_handle);
      __cxa_guard_release(&write(_IO_FILE*)::rawdata);
    }
  }
  this_00 = (vector<char,_std::allocator<char>_> *)
            std::vector<char,_std::allocator<char>_>::size(&write::compdata);
  iVar2 = sc_dt::sc_signed::length(this->object);
  if (this_00 <= (vector<char,_std::allocator<char>_> *)(long)iVar2) {
    iVar2 = sc_dt::sc_signed::length(this->object);
    in_stack_ffffffffffffff50 = (sc_signed *)((long)iVar2 + 0x1000U & 0xfffffffffffff000);
    local_49 = 0;
    __n_00 = &local_4a;
    local_30 = in_stack_ffffffffffffff50;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              (this_00,(size_type)__n_00,(value_type_conflict *)in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff48);
    std::vector<char,_std::allocator<char>_>::swap
              ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff50,
               (vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff48);
    std::vector<char,_std::allocator<char>_>::~vector(this_00);
    std::allocator<char>::~allocator(&local_4a);
    local_69 = 0;
    in_stack_ffffffffffffff48 = &local_6a;
    in_stack_ffffffffffffff40 = local_30;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              (this_00,(size_type)__n_00,(value_type_conflict *)in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff48);
    std::vector<char,_std::allocator<char>_>::swap
              ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff50,
               (vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff48);
    std::vector<char,_std::allocator<char>_>::~vector(this_00);
    std::allocator<char>::~allocator(&local_6a);
  }
  local_78 = std::vector<char,_std::allocator<char>_>::operator[](&write::rawdata,0);
  local_7c = sc_dt::sc_signed::length(this->object);
  while (local_7c = local_7c + -1, -1 < local_7c) {
    sc_dt::sc_signed::operator[]
              (in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    bVar1 = sc_dt::sc_signed_bitref_r::to_bool((sc_signed_bitref_r *)0x2d6116);
    *local_78 = "01"[bVar1];
    local_78 = local_78 + 1;
  }
  *local_78 = '\0';
  psVar3 = (sc_signed *)std::vector<char,_std::allocator<char>_>::operator[](&write::rawdata,0);
  std::vector<char,_std::allocator<char>_>::operator[](&write::compdata,0);
  vcd_trace::compose_data_line
            (in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,(char *)this_00);
  __s = std::vector<char,_std::allocator<char>_>::operator[](&write::compdata,0);
  fputs(__s,(FILE *)local_12._2_8_);
  psVar3 = sc_dt::sc_signed::operator=(in_stack_ffffffffffffff40,psVar3);
  return (ssize_t)psVar3;
}

Assistant:

void
vcd_sc_signed_trace::write(FILE* f)
{
    static std::vector<char> compdata(1024), rawdata(1024);
    typedef std::vector<char>::size_type size_t;

    if ( compdata.size() <= static_cast<size_t>(object.length()) ) { // include trailing \0
        size_t sz = ( static_cast<size_t>(object.length()) + 4096 ) & (~static_cast<size_t>(4096-1));
        std::vector<char>( sz ).swap( compdata ); // resize without copying values
        std::vector<char>( sz ).swap( rawdata );
    }
    char *rawdata_ptr  = &rawdata[0];

    for (int bitindex = object.length() - 1; bitindex >= 0; --bitindex) {
        *rawdata_ptr++ = "01"[object[bitindex].to_bool()];
    }
    *rawdata_ptr = '\0';
    compose_data_line(&rawdata[0], &compdata[0]);

    std::fputs(&compdata[0], f);
    old_value = object;
}